

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O0

uint asmjit::_abi_1_10::Support::lsbMask<unsigned_int,unsigned_int>(uint *n)

{
  uint *n_local;
  
  return (int)(1L << ((byte)*n & 0x3f)) - 1;
}

Assistant:

static constexpr T lsbMask(const CountT& n) noexcept {
  typedef typename std::make_unsigned<T>::type U;
  return (sizeof(U) < sizeof(uintptr_t))
    // Prevent undefined behavior by using a larger type than T.
    ? T(U((uintptr_t(1) << n) - uintptr_t(1)))
    // Prevent undefined behavior by checking `n` before shift.
    : n ? T(shr(allOnes<T>(), bitSizeOf<T>() - size_t(n))) : T(0);
}